

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  type_info *tp;
  void *__ptr;
  uint __val;
  _Alloc_hider _Var3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  type_info *ptVar9;
  function_record *pfVar10;
  function_record *pfVar11;
  PyMethodDef *pPVar12;
  PyObject *pPVar13;
  long *plVar14;
  PyObject *pPVar15;
  object *poVar16;
  ulong uVar17;
  PyTypeObject *pPVar18;
  ulong uVar19;
  size_type *psVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  long *plVar22;
  object *object;
  uint uVar23;
  pointer paVar24;
  long lVar25;
  function_record *pfVar26;
  char cVar27;
  long lVar28;
  uint __len;
  function_record *value;
  long lVar29;
  bool bVar30;
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  PyMappingMethods *local_1b8;
  function_record *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  PySequenceMethods *local_160;
  PyMappingMethods *local_158;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_150;
  function_record *local_130;
  PyBufferProcs *local_128;
  handle local_120;
  str local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pcVar8 = "";
  if (rec->name != (char *)0x0) {
    pcVar8 = rec->name;
  }
  local_160 = (PySequenceMethods *)this;
  local_158 = (PyMappingMethods *)args;
  local_130 = (function_record *)types;
  pcVar8 = strdup(pcVar8);
  rec->name = pcVar8;
  if (rec->doc != (char *)0x0) {
    pcVar8 = strdup(rec->doc);
    rec->doc = pcVar8;
  }
  paVar24 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0 = rec;
  if (paVar24 != paVar2) {
    do {
      if (*(char **)paVar24 != (char *)0x0) {
        pcVar8 = strdup(*(char **)paVar24);
        *(char **)paVar24 = pcVar8;
      }
      if (*(char **)(paVar24 + 8) == (char *)0x0) {
        if (*(long *)(paVar24 + 0x10) != 0) {
          local_1d8._8_8_ = *(undefined8 *)(paVar24 + 0x10);
          local_1c8._0_8_ = "__repr__";
          local_1c8._8_8_ = 0;
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&local_1a8);
          cast<std::__cxx11::string>(&local_150,(pybind11 *)&local_1a8,object);
          _Var3._M_p = local_150._M_dataplus._M_p;
          pcVar8 = strdup(local_150._M_dataplus._M_p);
          *(char **)(paVar24 + 8) = pcVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_150.field_2) {
            operator_delete(_Var3._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          pybind11::object::~object((object *)&local_1a8);
          pybind11::object::~object((object *)(local_1c8 + 8));
        }
      }
      else {
        pcVar8 = strdup(*(char **)(paVar24 + 8));
        *(char **)(paVar24 + 8) = pcVar8;
      }
      paVar24 = paVar24 + 0x20;
    } while (paVar24 != paVar2);
  }
  local_128 = (PyBufferProcs *)&local_1b0->args;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_1b8 = (PyMappingMethods *)0x0;
  lVar29 = 0;
  lVar25 = 0;
  lVar28 = 0;
  do {
    bVar1 = text[lVar25];
    lVar25 = lVar25 + 1;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0) {
        bVar30 = false;
      }
      else if (bVar1 == 0x25) {
        tp = *(type_info **)((long)local_130 + lVar29 * 8);
        if (tp == (type_info *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        ptVar9 = detail::get_type_info(tp,false);
        lVar29 = lVar29 + 1;
        if (ptVar9 == (type_info *)0x0) {
          std::__cxx11::string::string
                    ((string *)local_1d8,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                     (allocator *)&local_1a8);
          detail::clean_type_id((string *)local_1d8);
          std::__cxx11::string::_M_append((char *)&local_150,local_1d8._0_8_);
          if ((PyTypeObject *)local_1d8._0_8_ != (PyTypeObject *)local_1c8) {
            operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8._0_8_ + 1));
          }
          goto LAB_001162c8;
        }
        bVar30 = true;
        std::__cxx11::string::append((char *)&local_150);
      }
      else {
LAB_001160d2:
        bVar30 = true;
        std::__cxx11::string::push_back((char)&local_150);
      }
    }
    else if (bVar1 == 0x7d) {
      bVar30 = true;
      lVar28 = lVar28 + -1;
      if (lVar28 == 0) {
        paVar24 = (local_1b0->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_1b8 <
             (PyMappingMethods *)
             ((long)(local_1b0->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar24 >> 5)) &&
           (*(long *)(paVar24 + (long)local_1b8 * 0x20 + 8) != 0)) {
          std::__cxx11::string::append((char *)&local_150);
          std::__cxx11::string::append((char *)&local_150);
        }
        local_1b8 = (PyMappingMethods *)((long)&local_1b8->mp_length + 1);
        lVar28 = 0;
      }
    }
    else {
      if (bVar1 != 0x7b) goto LAB_001160d2;
      if ((lVar28 == 0) && (local_1b8 < local_158 && text[lVar25] != '*')) {
        paVar24 = (local_1b0->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((paVar24 ==
              (local_1b0->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (*(long *)(paVar24 + (long)local_1b8 * 0x20) == 0)) &&
           ((local_1b8 != (PyMappingMethods *)0x0 || ((local_1b0->field_0x59 & 0x20) == 0)))) {
          uVar19 = (long)local_1b8 - (ulong)(((byte)local_1b0->field_0x59 >> 5 & 1) != 0);
          cVar27 = '\x01';
          if (9 < uVar19) {
            uVar17 = uVar19;
            cVar5 = '\x04';
            do {
              cVar27 = cVar5;
              if (uVar17 < 100) {
                cVar27 = cVar27 + -2;
                goto LAB_001161e0;
              }
              if (uVar17 < 1000) {
                cVar27 = cVar27 + -1;
                goto LAB_001161e0;
              }
              if (uVar17 < 10000) goto LAB_001161e0;
              bVar30 = 99999 < uVar17;
              uVar17 = uVar17 / 10000;
              cVar5 = cVar27 + '\x04';
            } while (bVar30);
            cVar27 = cVar27 + '\x01';
          }
LAB_001161e0:
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar27);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1a8._M_dataplus._M_p,(uint)local_1a8._M_string_length,uVar19);
          plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x11e9f6);
          local_1d8._0_8_ = local_1c8;
          pPVar18 = (PyTypeObject *)(plVar14 + 2);
          if ((PyTypeObject *)*plVar14 == pPVar18) {
            local_1c8._0_8_ = (pPVar18->ob_base).ob_base.ob_refcnt;
            local_1c8._8_8_ = plVar14[3];
          }
          else {
            local_1c8._0_8_ = (pPVar18->ob_base).ob_base.ob_refcnt;
            local_1d8._0_8_ = (PyTypeObject *)*plVar14;
          }
          local_1d8._8_8_ = plVar14[1];
          *plVar14 = (long)pPVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_150,local_1d8._0_8_);
          if ((PyTypeObject *)local_1d8._0_8_ != (PyTypeObject *)local_1c8) {
            operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_150);
        }
        std::__cxx11::string::append((char *)&local_150);
      }
      lVar28 = lVar28 + 1;
LAB_001162c8:
      bVar30 = true;
    }
  } while (bVar30);
  if ((lVar28 != 0) || (*(type_info **)((long)local_130 + lVar29 * 8) != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar8 = strdup(local_150._M_dataplus._M_p);
  value = local_1b0;
  local_1b0->signature = pcVar8;
  if ((local_1b0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_1b0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)local_128);
  }
  pcVar8 = value->name;
  iVar6 = strcmp(pcVar8,"__init__");
  if (iVar6 == 0) {
    bVar30 = true;
  }
  else {
    iVar6 = strcmp(pcVar8,"__setstate__");
    bVar30 = iVar6 == 0;
  }
  value->field_0x59 = value->field_0x59 & 0xfe | bVar30;
  value->nargs = (uint16_t)local_158;
  pPVar13 = (value->sibling).m_ptr;
  if ((pPVar13 != (PyObject *)0x0) && (pPVar13->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (value->sibling).m_ptr = (PyObject *)pPVar13[1].ob_refcnt;
  }
  pPVar13 = (value->sibling).m_ptr;
  if (pPVar13 == (PyObject *)0x0) {
LAB_00116404:
    pfVar26 = (function_record *)0x0;
  }
  else {
    pPVar18 = pPVar13->ob_type;
    if ((pPVar18 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar6 = PyType_IsSubtype(pPVar18,&PyCFunction_Type), iVar6 == 0)) {
      if (((value->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*value->name != '_')) {
        std::__cxx11::string::string((string *)&local_180,value->name,(allocator *)&local_110);
        std::operator+(&local_1a8,"Cannot overload existing non-function object \"",&local_180);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_1a8);
        local_1d8._0_8_ = *plVar14;
        psVar20 = (size_type *)(plVar14 + 2);
        if ((size_type *)local_1d8._0_8_ == psVar20) {
          local_1c8._0_8_ = *psVar20;
          local_1c8._8_8_ = plVar14[3];
          local_1d8._0_8_ = local_1c8;
        }
        else {
          local_1c8._0_8_ = *psVar20;
        }
        local_1d8._8_8_ = plVar14[1];
        *plVar14 = (long)psVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        pybind11_fail((string *)local_1d8);
      }
      goto LAB_00116404;
    }
    pPVar13 = (value->sibling).m_ptr;
    if ((*(byte *)(pPVar13[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1d8._0_8_ = pPVar13[1].ob_type;
    }
    else {
      local_1d8._0_8_ = (PyTypeObject *)0x0;
    }
    if ((PyTypeObject *)local_1d8._0_8_ != (PyTypeObject *)0x0) {
      (((PyTypeObject *)local_1d8._0_8_)->ob_base).ob_base.ob_refcnt =
           (((PyTypeObject *)local_1d8._0_8_)->ob_base).ob_base.ob_refcnt + 1;
    }
    pfVar10 = capsule::operator_cast_to_function_record_((capsule *)local_1d8);
    pfVar26 = (function_record *)0x0;
    if ((pfVar10->scope).m_ptr == (value->scope).m_ptr) {
      pfVar26 = pfVar10;
    }
    pybind11::object::~object((object *)local_1d8);
  }
  if (pfVar26 != (function_record *)0x0) {
    pPVar13 = (value->sibling).m_ptr;
    (((function *)&local_160->sq_length)->super_object).super_handle.m_ptr = pPVar13;
    if (pPVar13 != (PyObject *)0x0) {
      pPVar13->ob_refcnt = pPVar13->ob_refcnt + 1;
    }
    bVar1 = value->field_0x59;
    pfVar10 = pfVar26;
    if (((pfVar26->field_0x59 ^ bVar1) & 0x20) != 0) {
      pcVar8 = "instance";
      if ((bVar1 & 0x20) == 0) {
        pcVar8 = "static";
      }
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,pcVar8,pcVar8 + (ulong)((bVar1 & 0x20) >> 5) * 2 + 6);
      std::operator+(&local_70,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0)
      ;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_f0._M_dataplus._M_p = (pointer)*plVar14;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar21) {
        local_f0.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_f0.field_2._8_8_ = plVar14[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      }
      local_f0._M_string_length = plVar14[1];
      *plVar14 = (long)paVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      local_50.obj.m_ptr = (local_1b0->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          (&local_50);
      local_120.m_ptr = (poVar16->super_handle).m_ptr;
      if (local_120.m_ptr != (PyObject *)0x0) {
        (local_120.m_ptr)->ob_refcnt = (local_120.m_ptr)->ob_refcnt + 1;
      }
      str::str(&local_118,(object *)&local_120);
      str::operator_cast_to_string(&local_90,&local_118);
      std::operator+(&local_110,&local_f0,&local_90);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_180._M_dataplus._M_p = (pointer)*plVar14;
      plVar22 = plVar14 + 2;
      if ((long *)local_180._M_dataplus._M_p == plVar22) {
        local_180.field_2._M_allocated_capacity = *plVar22;
        local_180.field_2._8_8_ = plVar14[3];
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *plVar22;
      }
      local_180._M_string_length = plVar14[1];
      *plVar14 = (long)plVar22;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::string((string *)&local_b0,local_1b0->name,&local_181);
      std::operator+(&local_1a8,&local_180,&local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_1a8,&local_150);
      pybind11_fail((string *)local_1d8);
    }
    do {
      pfVar11 = pfVar10;
      pfVar10 = pfVar11->next;
    } while (pfVar10 != (function_record *)0x0);
    pfVar11->next = value;
    pfVar10 = pfVar26;
    goto LAB_00116591;
  }
  pPVar12 = (PyMethodDef *)operator_new(0x20);
  *(undefined8 *)&pPVar12->ml_flags = 0;
  pPVar12->ml_doc = (char *)0x0;
  pPVar12->ml_name = (char *)0x0;
  pPVar12->ml_meth = (PyCFunction)0x0;
  value->def = pPVar12;
  *(undefined8 *)&pPVar12->ml_flags = 0;
  pPVar12->ml_doc = (char *)0x0;
  pPVar12->ml_name = (char *)0x0;
  pPVar12->ml_meth = (PyCFunction)0x0;
  pPVar12->ml_name = value->name;
  pPVar12->ml_meth = dispatcher;
  pPVar12->ml_flags = 3;
  capsule::capsule((capsule *)&local_1a8,value,initialize_generic::anon_class_1_0_00000001::__invoke
                  );
  local_180._M_dataplus._M_p = (pointer)0x0;
  pPVar13 = (value->scope).m_ptr;
  if (pPVar13 != (PyObject *)0x0) {
    iVar6 = PyObject_HasAttrString(pPVar13,"__module__");
    if (iVar6 == 1) {
      local_1d8._8_8_ = (value->scope).m_ptr;
      local_1c8._0_8_ = "__module__";
      local_1c8._8_8_ = 0;
      poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1d8);
    }
    else {
      iVar6 = PyObject_HasAttrString((value->scope).m_ptr,"__name__");
      if (iVar6 != 1) goto LAB_00116554;
      local_1d8._8_8_ = (value->scope).m_ptr;
      local_1c8._0_8_ = "__name__";
      local_1c8._8_8_ = 0;
      poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1d8);
    }
    local_110._M_dataplus._M_p = (pointer)(poVar16->super_handle).m_ptr;
    if ((PyObject *)local_110._M_dataplus._M_p != (PyObject *)0x0) {
      ((PyObject *)local_110._M_dataplus._M_p)->ob_refcnt =
           ((PyObject *)local_110._M_dataplus._M_p)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)&local_180,(object *)&local_110);
    pybind11::object::~object((object *)&local_110);
    pybind11::object::~object((object *)(local_1c8 + 8));
  }
LAB_00116554:
  pPVar13 = (PyObject *)
            PyCMethod_New(value->def,local_1a8._M_dataplus._M_p,local_180._M_dataplus._M_p,0);
  (((function *)&local_160->sq_length)->super_object).super_handle.m_ptr = pPVar13;
  if (pPVar13 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)&local_180);
  pybind11::object::~object((object *)&local_1a8);
  pfVar10 = value;
LAB_00116591:
  local_1d8._0_8_ = local_1c8;
  local_1d8._8_8_ = (PyObject *)0x0;
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
  pcVar8 = (char *)local_1d8._0_8_;
  if ((pfVar26 != (function_record *)0x0) &&
     (pcVar8 = &options::global_state()::instance, DAT_00126a79 == '\x01')) {
    std::__cxx11::string::append(local_1d8);
    std::__cxx11::string::append(local_1d8);
    pcVar8 = (char *)std::__cxx11::string::append(local_1d8);
  }
  iVar6 = 0;
  local_158 = (PyMappingMethods *)
              CONCAT44(local_158._4_4_,(int)CONCAT71((int7)((ulong)pcVar8 >> 8),1));
  local_130 = pfVar26;
  do {
    if (DAT_00126a79 == '\x01') {
      if (0 < iVar6) {
        std::__cxx11::string::append(local_1d8);
      }
      if (pfVar26 != (function_record *)0x0) {
        uVar23 = iVar6 + 1;
        local_1b8 = (PyMappingMethods *)CONCAT44(local_1b8._4_4_,uVar23);
        __val = -uVar23;
        if (0 < (int)uVar23) {
          __val = uVar23;
        }
        __len = 1;
        if (9 < __val) {
          uVar19 = (ulong)__val;
          uVar4 = 4;
          do {
            __len = uVar4;
            uVar7 = (uint)uVar19;
            if (uVar7 < 100) {
              __len = __len - 2;
              goto LAB_00116686;
            }
            if (uVar7 < 1000) {
              __len = __len - 1;
              goto LAB_00116686;
            }
            if (uVar7 < 10000) goto LAB_00116686;
            uVar19 = uVar19 / 10000;
            uVar4 = __len + 4;
          } while (99999 < uVar7);
          __len = __len + 1;
        }
LAB_00116686:
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_180,(char)__len - (char)((int)uVar23 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_180._M_dataplus._M_p + (uVar23 >> 0x1f),__len,__val);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_180);
        pfVar26 = local_130;
        value = local_1b0;
        psVar20 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_1a8.field_2._M_allocated_capacity = *psVar20;
          local_1a8.field_2._8_8_ = plVar14[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar20;
          local_1a8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_1a8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append(local_1d8,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,
                          (ulong)(local_180.field_2._M_allocated_capacity + 1));
        }
        iVar6 = (int)local_1b8;
      }
      std::__cxx11::string::append(local_1d8);
      std::__cxx11::string::append(local_1d8);
      std::__cxx11::string::append(local_1d8);
    }
    if (((pfVar10->doc != (char *)0x0) && (*pfVar10->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (DAT_00126a79 == '\0') {
        if (((ulong)local_158 & 1) == 0) {
          std::__cxx11::string::append(local_1d8);
        }
        else {
          local_158 = (PyMappingMethods *)((ulong)local_158 & 0xffffffff00000000);
        }
      }
      if (DAT_00126a79 == '\x01') {
        std::__cxx11::string::append(local_1d8);
      }
      std::__cxx11::string::append(local_1d8);
      if (DAT_00126a79 == '\x01') {
        std::__cxx11::string::append(local_1d8);
      }
    }
    pfVar10 = pfVar10->next;
    if (pfVar10 == (function_record *)0x0) {
      pPVar13 = (((function *)&local_160->sq_length)->super_object).super_handle.m_ptr;
      __ptr = *(void **)(pPVar13[1].ob_refcnt + 0x18);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      pcVar8 = strdup((char *)local_1d8._0_8_);
      *(char **)(pPVar13[1].ob_refcnt + 0x18) = pcVar8;
      if ((value->field_0x59 & 0x20) != 0) {
        pPVar15 = (PyObject *)
                  PyInstanceMethod_New
                            ((((function *)&local_160->sq_length)->super_object).super_handle.m_ptr)
        ;
        (((function *)&local_160->sq_length)->super_object).super_handle.m_ptr = pPVar15;
        if (pPVar15 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar13->ob_refcnt = pPVar13->ob_refcnt + -1;
        if (pPVar13->ob_refcnt == 0) {
          _Py_Dealloc(pPVar13);
        }
      }
      if ((undefined1 *)local_1d8._0_8_ != local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty() && rec->args[arg_index].name) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CONSTEXPR_DESCR)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }